

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O2

char ** strchrexplode(char *strP,char sep)

{
  char *haystack;
  unsigned_long uVar1;
  char **ppcVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  char *__s;
  
  if (strP != (char *)0x0) {
    haystack = strdup(strP);
    if (*haystack != '\0') {
      uVar1 = strchrcount(haystack,sep);
      ppcVar2 = (char **)calloc(1,uVar1 * 8 + 0x10);
      strchrrep(haystack,sep,'\0');
      __s = haystack;
      for (lVar5 = 0; uVar1 + 1 != lVar5; lVar5 = lVar5 + 1) {
        if (*__s == '\0') {
          pcVar3 = (char *)malloc(1);
          *pcVar3 = '\0';
        }
        else {
          pcVar3 = strdup(__s);
        }
        ppcVar2[lVar5] = pcVar3;
        sVar4 = strlen(__s);
        __s = __s + sVar4 + 1;
      }
      free(haystack);
      return ppcVar2;
    }
    free(haystack);
  }
  return (char **)0x0;
}

Assistant:

char ** strchrexplode(char * strP, char sep)
{
	unsigned long   count, i;
	char **         array;
	char *          str;
	char *          originalstr;

	if(!strP)
		return 0;

	str = strdup(strP);
	originalstr = str;

	if(strlen(str)==0)
	{
		strfree(originalstr);
		return 0;
	}

	count = strchrcount(str, sep)+1;

	array = (char **)malloc(sizeof(char *)*(count+1));
	memset(array, 0, (sizeof(char *)*(count+1)));

	strchrrep(str, sep, '\0');

	for(i=0;i<count;i++)
	{
		if(!strlen(str))
		{
			array[i] = (char *)malloc(1);
			array[i][0] = '\0';
		}
		else
		   array[i] = strdup(str);

		str = str+strlen(str)+1;
	}

	free(originalstr);

	return array;
}